

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniscript.h
# Opt level: O0

void __thiscall
miniscript::internal::InputStack::InputStack
          (InputStack *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *in)

{
  long lVar1;
  size_type sVar2;
  undefined4 *in_RDI;
  long in_FS_OFFSET;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_00000008;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffffc8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  *in_RDI = 1;
  *(undefined1 *)(in_RDI + 1) = 0;
  *(undefined1 *)((long)in_RDI + 5) = 0;
  *(undefined1 *)((long)in_RDI + 6) = 0;
  sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    (in_stack_ffffffffffffffc8);
  *(size_type *)(in_RDI + 2) = sVar2 + 1;
  Vector<std::vector<unsigned_char,std::allocator<unsigned_char>>>(in_stack_00000008);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

InputStack(std::vector<unsigned char> in) : size(in.size() + 1), stack(Vector(std::move(in))) {}